

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_a64d2::ir_vectorize_visitor::visit_enter
          (ir_vectorize_visitor *this,ir_expression *ir)

{
  ir_visitor_status iVar1;
  uint uVar2;
  
  iVar1 = visit_continue;
  uVar2 = ir->operation - ir_binop_all_equal;
  if ((uVar2 < 0x1b) && ((0x5014403U >> (uVar2 & 0x1f) & 1) != 0)) {
    this->current_assignment = (ir_assignment *)0x0;
    iVar1 = visit_continue_with_parent;
  }
  return iVar1;
}

Assistant:

bool is_horizontal() const
   {
      return operation == ir_binop_all_equal ||
             operation == ir_binop_any_nequal ||
             operation == ir_binop_dot ||
             operation == ir_binop_vector_extract ||
             operation == ir_triop_vector_insert ||
             operation == ir_binop_ubo_load ||
             operation == ir_quadop_vector;
   }